

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

ExtensionRangeOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(Arena *arena)

{
  ExtensionRangeOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (ExtensionRangeOptions *)operator_new(0x48);
    ExtensionRangeOptions::ExtensionRangeOptions(this);
  }
  else {
    AllocHook(arena,(type_info *)&ExtensionRangeOptions::typeinfo,0x48);
    this = (ExtensionRangeOptions *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x48);
    ExtensionRangeOptions::ExtensionRangeOptions(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}